

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O1

void G_xor(uint8_t *out,uint8_t *X,uint8_t *Y)

{
  uint i;
  long lVar1;
  uint64_t R [128];
  uint64_t Z [128];
  uint64_t Q [128];
  ulong local_c18 [128];
  ulong local_818 [128];
  uint64_t local_418 [129];
  
  lVar1 = 0;
  do {
    local_c18[lVar1] = *(ulong *)(Y + lVar1 * 8) ^ *(ulong *)(X + lVar1 * 8);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x80);
  lVar1 = 0;
  do {
    P((uint64_t *)((long)local_418 + lVar1),2,(uint64_t *)((long)local_c18 + lVar1),2);
    lVar1 = lVar1 + 0x80;
  } while (lVar1 != 0x400);
  lVar1 = 0;
  do {
    P((uint64_t *)((long)local_818 + lVar1),0x10,(uint64_t *)((long)local_418 + lVar1),0x10);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x80);
  lVar1 = 0;
  do {
    *(ulong *)(out + lVar1 * 8) = *(ulong *)(out + lVar1 * 8) ^ local_818[lVar1] ^ local_c18[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x80);
  smemclr(local_c18,0x400);
  smemclr(local_418,0x400);
  smemclr(local_818,0x400);
  return;
}

Assistant:

static void G_xor(uint8_t *out, const uint8_t *X, const uint8_t *Y)
{
    uint64_t R[128], Q[128], Z[128];

    for (unsigned i = 0; i < 128; i++)
        R[i] = GET_64BIT_LSB_FIRST(X + 8*i) ^ GET_64BIT_LSB_FIRST(Y + 8*i);

    for (unsigned i = 0; i < 8; i++)
        P(Q+16*i, 2, R+16*i, 2);

    for (unsigned i = 0; i < 8; i++)
        P(Z+2*i, 16, Q+2*i, 16);

    for (unsigned i = 0; i < 128; i++)
        PUT_64BIT_LSB_FIRST(out + 8*i,
                            GET_64BIT_LSB_FIRST(out + 8*i) ^ R[i] ^ Z[i]);

    smemclr(R, sizeof(R));
    smemclr(Q, sizeof(Q));
    smemclr(Z, sizeof(Z));
}